

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::
doWalk(TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *this)

{
  bool bVar1;
  reference pvVar2;
  HeapTypeChildCollector *pHVar3;
  Task TVar4;
  value_type local_68;
  value_type local_58;
  value_type local_48;
  value_type local_38;
  ulong uStack_28;
  value_type curr;
  TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *this_local;
  
  while (bVar1 = std::
                 vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                 ::empty(&this->taskList), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::
             vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
             ::back(&this->taskList);
    uStack_28 = *(ulong *)pvVar2;
    curr._0_8_ = pvVar2->field_1;
    std::
    vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
    ::pop_back(&this->taskList);
    switch(uStack_28 & 0xffffffff) {
    case 0:
      pHVar3 = self(this);
      preVisitType((TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *)
                   pHVar3,(Type *)curr._0_8_);
      break;
    case 1:
      pHVar3 = self(this);
      preVisitHeapType((TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *)
                       pHVar3,(HeapType *)curr._0_8_);
      break;
    case 2:
      TVar4 = Task::postVisit((Type *)curr._0_8_);
      local_38.field_1 = TVar4.field_1;
      local_38.kind = TVar4.kind;
      std::
      vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ::push_back(&this->taskList,&local_38);
      pHVar3 = self(this);
      HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>::scanType
                (&pHVar3->
                  super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>,
                 (Type *)curr._0_8_);
      TVar4 = Task::preVisit((Type *)curr._0_8_);
      local_48.field_1 = TVar4.field_1;
      local_48.kind = TVar4.kind;
      std::
      vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ::push_back(&this->taskList,&local_48);
      break;
    case 3:
      TVar4 = Task::postVisit((HeapType *)curr._0_8_);
      local_58.field_1 = TVar4.field_1;
      local_58.kind = TVar4.kind;
      std::
      vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ::push_back(&this->taskList,&local_58);
      pHVar3 = self(this);
      HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>::scanHeapType
                (&pHVar3->
                  super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>,
                 (HeapType *)curr._0_8_);
      TVar4 = Task::preVisit((HeapType *)curr._0_8_);
      local_68.field_1 = TVar4.field_1;
      local_68.kind = TVar4.kind;
      std::
      vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ::push_back(&this->taskList,&local_68);
      break;
    case 4:
      pHVar3 = self(this);
      postVisitType((TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *)
                    pHVar3,(Type *)curr._0_8_);
      break;
    case 5:
      pHVar3 = self(this);
      postVisitHeapType((TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *)
                        pHVar3,(HeapType *)curr._0_8_);
    }
  }
  return;
}

Assistant:

void TypeGraphWalkerBase<Self>::doWalk() {
  while (!taskList.empty()) {
    auto curr = taskList.back();
    taskList.pop_back();
    switch (curr.kind) {
      case Task::PreType:
        self().preVisitType(curr.type);
        break;
      case Task::PreHeapType:
        self().preVisitHeapType(curr.heapType);
        break;
      case Task::ScanType:
        taskList.push_back(Task::postVisit(curr.type));
        self().scanType(curr.type);
        taskList.push_back(Task::preVisit(curr.type));
        break;
      case Task::ScanHeapType:
        taskList.push_back(Task::postVisit(curr.heapType));
        self().scanHeapType(curr.heapType);
        taskList.push_back(Task::preVisit(curr.heapType));
        break;
      case Task::PostType:
        self().postVisitType(curr.type);
        break;
      case Task::PostHeapType:
        self().postVisitHeapType(curr.heapType);
        break;
    }
  }
}